

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_square>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  long lVar4;
  int iVar5;
  long *in_RDI;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_square op;
  Mat *m;
  float fStack_284;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  int local_25c;
  undefined1 (*local_210) [32];
  int local_208;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float local_40;
  float fStack_3c;
  float fStack_38;
  
  lVar4 = in_RDI[7];
  iVar5 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_208 = 0; local_208 < (int)lVar4; local_208 = local_208 + 1) {
    local_210 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_208 * in_RDI[2]);
    for (local_25c = 0; local_25c + 7 < iVar5; local_25c = local_25c + 8) {
      auVar3 = *(undefined1 (*) [12])*local_210;
      fStack_274 = (float)((ulong)*(undefined8 *)(*local_210 + 8) >> 0x20);
      fStack_270 = (float)*(undefined8 *)(*local_210 + 0x10);
      fStack_26c = (float)((ulong)*(undefined8 *)(*local_210 + 0x10) >> 0x20);
      fStack_268 = (float)*(undefined8 *)(*local_210 + 0x18);
      uStack_264 = (undefined4)((ulong)*(undefined8 *)(*local_210 + 0x18) >> 0x20);
      local_80 = auVar3._0_4_;
      fStack_7c = auVar3._4_4_;
      fStack_78 = auVar3._8_4_;
      local_a0 = (float)*(undefined8 *)*local_210;
      fStack_9c = (float)((ulong)*(undefined8 *)*local_210 >> 0x20);
      fStack_98 = (float)*(undefined8 *)(*local_210 + 8);
      auVar1._4_4_ = fStack_7c * fStack_9c;
      auVar1._0_4_ = local_80 * local_a0;
      auVar1._12_4_ = fStack_274 * fStack_274;
      auVar1._8_4_ = fStack_78 * fStack_98;
      auVar1._20_4_ = fStack_26c * fStack_26c;
      auVar1._16_4_ = fStack_270 * fStack_270;
      auVar1._28_4_ = uStack_264;
      auVar1._24_4_ = fStack_268 * fStack_268;
      *local_210 = auVar1;
      local_210 = local_210 + 1;
    }
    for (; local_25c + 3 < iVar5; local_25c = local_25c + 4) {
      auVar3 = *(undefined1 (*) [12])*local_210;
      fStack_284 = (float)((ulong)*(undefined8 *)(*local_210 + 8) >> 0x20);
      local_40 = auVar3._0_4_;
      fStack_3c = auVar3._4_4_;
      fStack_38 = auVar3._8_4_;
      local_50 = (float)*(undefined8 *)*local_210;
      fStack_4c = (float)((ulong)*(undefined8 *)*local_210 >> 0x20);
      fStack_48 = (float)*(undefined8 *)(*local_210 + 8);
      auVar2._4_4_ = fStack_3c * fStack_4c;
      auVar2._0_4_ = local_40 * local_50;
      auVar2._12_4_ = fStack_284 * fStack_284;
      auVar2._8_4_ = fStack_38 * fStack_48;
      *(undefined1 (*) [16])*local_210 = auVar2;
      local_210 = (undefined1 (*) [32])(*local_210 + 0x10);
    }
    for (; local_25c < iVar5; local_25c = local_25c + 1) {
      *(float *)*local_210 = *(float *)*local_210 * *(float *)*local_210;
      local_210 = (undefined1 (*) [32])(*local_210 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}